

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  alpnid dstalpnid;
  _Bool _Var3;
  byte bVar4;
  unsigned_short uVar5;
  int iVar6;
  size_t sVar7;
  altsvc *p;
  time_t tVar8;
  byte *pbVar9;
  char *pcVar10;
  bool bVar11;
  size_t __n;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  bool bVar16;
  char alpnbuf [10];
  char *end_ptr;
  char option [32];
  char namebuf [512];
  uint local_2b0;
  undefined4 local_2a4;
  char local_2a0 [16];
  byte *local_290;
  long local_288;
  char *local_280;
  altsvcinfo *local_278;
  ulong local_270;
  char *local_268;
  Curl_llist *local_260;
  char local_258 [32];
  char local_238 [520];
  
  local_278 = asi;
  memset(local_238,0,0x200);
  local_2a0[8] = '\0';
  local_2a0[9] = '\0';
  local_2a0[0] = '\0';
  local_2a0[1] = '\0';
  local_2a0[2] = '\0';
  local_2a0[3] = '\0';
  local_2a0[4] = '\0';
  local_2a0[5] = '\0';
  local_2a0[6] = '\0';
  local_2a0[7] = '\0';
  for (; (bVar4 = *value, bVar4 == 9 || (bVar4 == 0x20)); value = (char *)((byte *)value + 1)) {
  }
  uVar12 = 0;
  while ((0x3d < bVar4 || ((0x2800000100000201U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
    bVar4 = ((byte *)value)[uVar12 + 1];
    uVar12 = uVar12 + 1;
  }
  if (uVar12 == 0 || 9 < uVar12) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"Excessive alt-svc header, ignoring.");
    }
  }
  else {
    memcpy(local_2a0,value,uVar12);
    local_2a0[uVar12] = '\0';
    iVar6 = curl_strequal(local_2a0,"clear");
    if (iVar6 == 0) {
      pbVar9 = (byte *)value + uVar12;
      uVar12 = (ulong)*pbVar9;
      local_260 = &local_278->list;
      local_288 = 0;
      local_2b0 = (uint)srcport;
      local_268 = srchost;
      while (((char)uVar12 == '=' && (local_2a4 = alpn2alpnid(local_2a0), pbVar9[1] == 0x22))) {
        pbVar14 = pbVar9 + 2;
        bVar4 = pbVar9[2];
        pbVar13 = pbVar14;
        if (bVar4 == 0) {
LAB_00110f8c:
          __n = (long)pbVar13 - (long)pbVar14;
LAB_00110f92:
          bVar16 = __n - 1 < 0x1ff;
          if (bVar16) {
            pcVar10 = local_238;
            memcpy(pcVar10,pbVar14,__n);
            local_238[__n] = '\0';
          }
          else {
            pcVar10 = "";
            if (((data != (Curl_easy *)0x0) && (pcVar10 = "", ((data->set).field_0x8cd & 0x10) != 0)
                ) && ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                      (pcVar10 = "", 0 < pcVar1->log_level)))) {
              Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
              pcVar10 = "";
            }
          }
          bVar4 = *pbVar13;
          pbVar14 = pbVar13;
          local_280 = pcVar10;
          if (bVar4 == 0x3a) goto LAB_00111031;
        }
        else {
          if (bVar4 != 0x3a) {
            if (bVar4 != 0x5b) {
              do {
                if ((0x19 < (byte)(bVar4 + 0x9f) && 9 < (byte)(bVar4 - 0x30)) &&
                   (0x19 < (byte)(bVar4 + 0xbf) && 1 < (byte)(bVar4 - 0x2d))) break;
                bVar4 = pbVar13[1];
                pbVar13 = pbVar13 + 1;
              } while (bVar4 != 0);
              goto LAB_00110f8c;
            }
            sVar7 = strspn((char *)(pbVar9 + 3),"0123456789abcdefABCDEF:.");
            if (pbVar9[sVar7 + 3] != 0x5d) {
              return CURLE_OK;
            }
            __n = sVar7 + 2;
            pbVar13 = pbVar9 + sVar7 + 4;
            goto LAB_00110f92;
          }
          bVar16 = true;
          local_280 = srchost;
LAB_00111031:
          pbVar13 = pbVar14 + 1;
          pbVar9 = pbVar13;
          if (((((byte)(pbVar14[1] - 0x30) < 10) &&
               (uVar12 = strtoul((char *)pbVar13,(char **)&local_290,10), pbVar9 = local_290,
               0xffffffffffff0000 < uVar12 - 0x10000)) && (local_290 != pbVar13)) &&
             (*local_290 == 0x22)) {
            uVar5 = curlx_ultous(uVar12);
            local_2b0 = (uint)uVar5;
            pbVar13 = pbVar9;
          }
          else {
            local_290 = pbVar9;
            if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
               ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                (pcVar1->log_level < 1)))) {
              bVar16 = false;
            }
            else {
              bVar16 = false;
              Curl_infof(data,"Unknown alt-svc port number, ignoring.");
            }
          }
          bVar4 = *pbVar13;
        }
        if (bVar4 != 0x22) {
          return CURLE_OK;
        }
        pbVar9 = pbVar13 + 1;
        local_270 = 0x15180;
        bVar11 = false;
        uVar12 = local_270;
        _Var3 = false;
LAB_001110ea:
        _Var2 = _Var3;
        local_270 = uVar12;
        srchost = local_268;
        dstalpnid = local_2a4;
        pbVar14 = pbVar9 + 2;
        while( true ) {
          pbVar13 = pbVar9 + 1;
          bVar4 = *pbVar9;
          if ((bVar4 != 9) && (bVar4 != 0x20)) break;
          pbVar14 = pbVar14 + 1;
          pbVar9 = pbVar13;
        }
        if (bVar4 == 0x3b) {
          bVar4 = *pbVar13;
          uVar12 = (ulong)bVar4;
          if ((0xd < bVar4) || (pbVar9 = pbVar13, (0x2401U >> (bVar4 & 0x1f) & 1) == 0)) {
            while (((char)uVar12 == '\t' || ((int)uVar12 == 0x20))) {
              pbVar9 = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
              pbVar14 = pbVar14 + 1;
              uVar12 = (ulong)*pbVar9;
            }
            uVar15 = 0;
            while ((0x3d < (byte)uVar12 || ((0x2800000100000201U >> (uVar12 & 0x3f) & 1) == 0))) {
              bVar4 = *pbVar14;
              uVar15 = uVar15 + 1;
              pbVar14 = pbVar14 + 1;
              uVar12 = (ulong)bVar4;
            }
            if (uVar15 < 0x20 && uVar15 != 0) {
              memcpy(local_258,pbVar13,uVar15);
              local_258[uVar15] = '\0';
            }
            else {
              local_258[0] = '\0';
            }
            for (pbVar13 = pbVar13 + uVar15; (bVar4 = *pbVar13, bVar4 == 9 || (bVar4 == 0x20));
                pbVar13 = pbVar13 + 1) {
              pbVar14 = pbVar14 + 1;
            }
            if (bVar4 != 0x3d) {
              return CURLE_OK;
            }
            do {
              bVar4 = *pbVar14;
              if (bVar4 < 0x20) {
                if (bVar4 != 9) goto LAB_001111cc;
              }
              else if (bVar4 != 0x20) {
                if (bVar4 != 0x22) goto LAB_001111e0;
                pbVar14 = pbVar14 + 1;
                pbVar13 = pbVar14;
                goto LAB_001111f7;
              }
              pbVar14 = pbVar14 + 1;
            } while( true );
          }
        }
        if (bVar16 && local_2a4 != ALPN_none) {
          if (local_288 == 0) {
            altsvc_flush(local_278,srcalpnid,local_268,srcport);
          }
          local_288 = local_288 + 1;
          p = altsvc_createid(srchost,local_280,srcalpnid,dstalpnid,(uint)srcport,local_2b0);
          if (p != (altsvc *)0x0) {
            tVar8 = time((time_t *)0x0);
            p->expires = tVar8 + local_270;
            p->persist = _Var2;
            Curl_llist_append(local_260,p,&p->node);
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                (0 < pcVar1->log_level)))) {
              pcVar10 = "h1";
              if (local_2a4 != ALPN_h1) {
                if (local_2a4 == ALPN_h3) {
                  pcVar10 = "h3";
                }
                else if (local_2a4 == ALPN_h2) {
                  pcVar10 = "h2";
                }
                else {
                  pcVar10 = "";
                }
              }
              Curl_infof(data,"Added alt-svc: %s:%d over %s",local_280,(ulong)local_2b0,pcVar10);
            }
          }
        }
        bVar4 = *pbVar9;
        if (bVar4 == 0x2c) {
          do {
            do {
              pbVar14 = pbVar9;
              pbVar13 = pbVar14 + 1;
              bVar4 = pbVar14[1];
              pbVar9 = pbVar13;
            } while (bVar4 == 9);
          } while (bVar4 == 0x20);
          uVar12 = 1;
          while ((0x3d < bVar4 || ((0x2800000100000201U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
            bVar4 = pbVar14[uVar12 + 1];
            uVar12 = uVar12 + 1;
          }
          if (uVar12 == 1) {
            return CURLE_OK;
          }
          if (10 < uVar12) {
            return CURLE_OK;
          }
          pbVar9 = pbVar14 + uVar12;
          memcpy(local_2a0,pbVar13,uVar12 - 1);
          *(undefined1 *)((long)&local_2a4 + uVar12 + 3) = 0;
          bVar4 = pbVar14[uVar12];
          srchost = local_268;
        }
        uVar12 = (ulong)bVar4;
        if ((bVar4 < 0x3c) && ((0x800000000002401U >> (uVar12 & 0x3f) & 1) != 0)) {
          return CURLE_OK;
        }
      }
    }
    else {
      altsvc_flush(local_278,srcalpnid,srchost,srcport);
    }
  }
  return CURLE_OK;
LAB_001111cc:
  if (bVar4 == 0) {
    return CURLE_OK;
  }
LAB_001111e0:
  pbVar9 = pbVar14;
  pbVar13 = pbVar14;
  if (bVar11) {
LAB_001111f7:
    do {
      pbVar9 = pbVar13 + 1;
      bVar4 = *pbVar13;
      if (bVar4 == 0) break;
      pbVar13 = pbVar9;
    } while (bVar4 != 0x22);
    bVar11 = true;
    if (bVar4 == 0) {
      return CURLE_OK;
    }
  }
  else {
    while ((0x3b < (ulong)*pbVar9 || ((0x800100100000201U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))) {
      pbVar9 = pbVar9 + 1;
    }
  }
  uVar15 = strtoul((char *)pbVar14,(char **)&local_290,10);
  uVar12 = local_270;
  _Var3 = _Var2;
  if (uVar15 != 0xffffffffffffffff && local_290 != pbVar14) {
    iVar6 = curl_strequal("ma",local_258);
    uVar12 = uVar15;
    if (iVar6 == 0) {
      iVar6 = curl_strequal("persist",local_258);
      if (uVar15 == 1) {
        _Var3 = true;
      }
      uVar12 = local_270;
      if (iVar6 == 0) {
        _Var3 = _Var2;
      }
    }
  }
  goto LAB_001110ea;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  size_t len;
  char namebuf[MAX_ALTSVC_HOSTLEN] = "";
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            len = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[len] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            len += 2;
            p = &p[len-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            len = p - hostp;
          }
          if(!len || (len >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            memcpy(namebuf, hostp, len);
            namebuf[len] = 0;
            dsthost = namebuf;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}